

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O2

void __thiscall QString::QString(QString *this,QChar *unicode,qsizetype size)

{
  char16_t *__dest;
  undefined1 auVar1 [16];
  long in_FS_OFFSET;
  pair<QTypedArrayData<char16_t>_*,_char16_t_*> local_40;
  long local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  (this->d).d = (Data *)0x0;
  (this->d).ptr = (char16_t *)0x0;
  (this->d).size = 0;
  if (unicode == (QChar *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      QArrayDataPointer<char16_t>::clear(&this->d);
      return;
    }
  }
  else {
    if (size < 0) {
      size = QtPrivate::qustrlen(&unicode->ucs);
    }
    if (size == 0) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = L"";
      local_40 = (pair<QTypedArrayData<char16_t>_*,_char16_t_*>)(auVar1 << 0x40);
      local_30 = 0;
      QArrayDataPointer<char16_t>::operator=(&this->d,(QArrayDataPointer<char16_t> *)&local_40);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_40);
    }
    else {
      local_40 = QTypedArrayData<char16_t>::allocate(size,KeepSize);
      local_30 = size;
      QArrayDataPointer<char16_t>::operator=(&this->d,(QArrayDataPointer<char16_t> *)&local_40);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_40);
      __dest = (this->d).ptr;
      if (__dest == (char16_t *)0x0) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
          qBadAlloc();
        }
        goto LAB_002ee54a;
      }
      memcpy(__dest,unicode,size * 2);
      (this->d).ptr[size] = L'\0';
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return;
    }
  }
LAB_002ee54a:
  __stack_chk_fail();
}

Assistant:

QString::QString(const QChar *unicode, qsizetype size)
{
    if (!unicode) {
        d.clear();
    } else {
        if (size < 0)
            size = QtPrivate::qustrlen(reinterpret_cast<const char16_t *>(unicode));
        if (!size) {
            d = DataPointer::fromRawData(&_empty, 0);
        } else {
            d = DataPointer(size, size);
            Q_CHECK_PTR(d.data());
            memcpy(d.data(), unicode, size * sizeof(QChar));
            d.data()[size] = '\0';
        }
    }
}